

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermAggregate * __thiscall
glslang::TIntermediate::mergeAggregate(TIntermediate *this,TIntermNode *left,TIntermNode *right)

{
  iterator iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  TPoolAllocator *this_00;
  TIntermAggregate *this_01;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined4 extraout_var_02;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *pvVar7;
  undefined4 extraout_var_03;
  long lVar6;
  TIntermNode *local_38;
  TIntermNode *local_30;
  undefined4 extraout_var_01;
  
  if (left == (TIntermNode *)0x0 && right == (TIntermNode *)0x0) {
    return (TIntermAggregate *)0x0;
  }
  local_38 = right;
  local_30 = left;
  if (left != (TIntermNode *)0x0) {
    iVar4 = (*left->_vptr_TIntermNode[6])(left);
    this_01 = (TIntermAggregate *)CONCAT44(extraout_var,iVar4);
    if ((this_01 != (TIntermAggregate *)0x0) && ((this_01->super_TIntermOperator).op == EOpNull))
    goto LAB_0040f56f;
  }
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
  TIntermAggregate::TIntermAggregate(this_01);
  if (left != (TIntermNode *)0x0) {
    iVar4 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_01);
    pvVar7 = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var_00,iVar4);
    iVar1._M_current = *(TIntermNode ***)(pvVar7 + 0x10);
    if (iVar1._M_current == *(TIntermNode ***)(pvVar7 + 0x18)) {
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
      _M_realloc_insert<TIntermNode*const&>(pvVar7,iVar1,&local_30);
    }
    else {
      *iVar1._M_current = left;
      *(long *)(pvVar7 + 0x10) = *(long *)(pvVar7 + 0x10) + 8;
    }
  }
LAB_0040f56f:
  iVar4 = (*right->_vptr_TIntermNode[6])(right);
  plVar5 = (long *)CONCAT44(extraout_var_01,iVar4);
  if ((plVar5 == (long *)0x0) || ((int)plVar5[0x17] != 0)) {
    iVar4 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_01);
    pvVar7 = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var_02,iVar4);
    iVar1._M_current = *(TIntermNode ***)(pvVar7 + 0x10);
    if (iVar1._M_current == *(TIntermNode ***)(pvVar7 + 0x18)) {
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
      _M_realloc_insert<TIntermNode*const&>(pvVar7,iVar1,&local_38);
    }
    else {
      *iVar1._M_current = right;
      *(long *)(pvVar7 + 0x10) = *(long *)(pvVar7 + 0x10) + 8;
    }
  }
  else {
    pvVar7._0_4_ = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode[0x32])(this_01);
    iVar4 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(this_01);
    uVar2 = *(undefined8 *)(CONCAT44(extraout_var_03,iVar4) + 0x10);
    lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
    uVar3 = *(undefined8 *)(lVar6 + 8);
    lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>>
              (pvVar7._0_4_,uVar2,uVar3,*(undefined8 *)(lVar6 + 0x10));
  }
  return this_01;
}

Assistant:

TIntermAggregate* TIntermediate::mergeAggregate(TIntermNode* left, TIntermNode* right)
{
    if (left == nullptr && right == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = nullptr;
    if (left != nullptr)
        aggNode = left->getAsAggregate();
    if (aggNode == nullptr || aggNode->getOp() != EOpNull) {
        aggNode = new TIntermAggregate;
        if (left != nullptr)
            aggNode->getSequence().push_back(left);
    }

    TIntermAggregate* rhsagg = right->getAsAggregate();
    if (rhsagg == nullptr || rhsagg->getOp() != EOpNull)
        aggNode->getSequence().push_back(right);
    else
        aggNode->getSequence().insert(aggNode->getSequence().end(),
                                      rhsagg->getSequence().begin(),
                                      rhsagg->getSequence().end());

    return aggNode;
}